

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O2

size_t FSE_writeNCount_generic
                 (void *header,size_t headerBufferSize,short *normalizedCounter,uint maxSymbolValue,
                 uint tableLog,uint writeIsSafe)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined2 *puVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  undefined2 *puVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  
  iVar5 = 1 << ((byte)tableLog & 0x1f);
  uVar12 = maxSymbolValue + 1;
  uVar16 = tableLog - 5;
  iVar11 = tableLog + 1;
  puVar8 = (undefined2 *)((long)header + (headerBufferSize - 2));
  iVar4 = 4;
  uVar14 = 0;
  bVar18 = false;
  puVar13 = (undefined2 *)header;
  uVar6 = iVar5 + 1;
  do {
    if ((uVar12 <= uVar14) || ((int)uVar6 < 2)) goto LAB_0013d53e;
    if (bVar18) {
      uVar17 = (ulong)uVar14;
      iVar15 = 0;
      while( true ) {
        if (uVar17 == uVar12) goto LAB_0013d53e;
        if (normalizedCounter[uVar17] != 0) break;
        uVar17 = uVar17 + 1;
        iVar15 = iVar15 + 1;
      }
      uVar7 = (uint)uVar17;
      if (uVar7 == uVar12) {
LAB_0013d53e:
        sVar3 = 0xffffffffffffffff;
        if ((uVar6 == 1) && ((writeIsSafe != 0 || (sVar3 = 0xffffffffffffffba, puVar13 <= puVar8))))
        {
          *puVar13 = (short)uVar16;
          sVar3 = (long)puVar13 + ((long)((iVar4 + 7) / 8) - (long)header);
        }
        return sVar3;
      }
      uVar10 = uVar14 + 3;
      while (uVar14 = uVar14 + 0x18, uVar14 <= uVar7) {
        if ((writeIsSafe == 0) && (puVar8 < puVar13)) {
          return 0xffffffffffffffba;
        }
        uVar16 = uVar16 + (0xffff << ((byte)iVar4 & 0x1f));
        *puVar13 = (short)uVar16;
        puVar13 = puVar13 + 1;
        uVar16 = uVar16 >> 0x10;
        iVar15 = iVar15 + -0x18;
        uVar10 = uVar10 + 0x18;
      }
      for (; uVar10 <= uVar7; uVar10 = uVar10 + 3) {
        uVar16 = uVar16 + (3 << ((byte)iVar4 & 0x1f));
        iVar4 = iVar4 + 2;
        iVar15 = iVar15 + -3;
      }
      uVar16 = (iVar15 << ((byte)iVar4 & 0x1f)) + uVar16;
      if (iVar4 < 0xf) {
        iVar4 = iVar4 + 2;
      }
      else {
        if ((writeIsSafe == 0) && (puVar8 < puVar13)) {
          return 0xffffffffffffffba;
        }
        *puVar13 = (short)uVar16;
        puVar13 = puVar13 + 1;
        uVar16 = uVar16 >> 0x10;
        iVar4 = iVar4 + -0xe;
      }
    }
    else {
      uVar17 = (ulong)uVar14;
    }
    iVar2 = (int)normalizedCounter[uVar17 & 0xffffffff];
    iVar15 = -iVar2;
    if (0 < iVar2) {
      iVar15 = iVar2;
    }
    iVar1 = ~uVar6 + iVar5 * 2;
    iVar9 = iVar1;
    if (iVar2 + 1 < iVar5) {
      iVar9 = 0;
    }
    iVar2 = iVar9 + iVar2 + 1;
    bVar18 = iVar2 == 1;
    uVar7 = uVar6 - iVar15;
    if (uVar7 == 0 || (int)uVar6 < iVar15) {
      return 0xffffffffffffffff;
    }
    uVar14 = (int)uVar17 + 1;
    uVar16 = (iVar2 << ((byte)iVar4 & 0x1f)) + uVar16;
    iVar4 = (iVar4 + iVar11) - (uint)(iVar2 < iVar1);
    for (; (int)uVar7 < iVar5; iVar5 = iVar5 >> 1) {
      iVar11 = iVar11 + -1;
    }
    uVar6 = uVar7;
    if (0x10 < iVar4) {
      if (writeIsSafe == 0 && puVar8 < puVar13) {
        return 0xffffffffffffffba;
      }
      *puVar13 = (short)uVar16;
      puVar13 = puVar13 + 1;
      uVar16 = uVar16 >> 0x10;
      iVar4 = iVar4 + -0x10;
    }
  } while( true );
}

Assistant:

static size_t
FSE_writeNCount_generic (void* header, size_t headerBufferSize,
                   const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                         unsigned writeIsSafe)
{
    BYTE* const ostart = (BYTE*) header;
    BYTE* out = ostart;
    BYTE* const oend = ostart + headerBufferSize;
    int nbBits;
    const int tableSize = 1 << tableLog;
    int remaining;
    int threshold;
    U32 bitStream = 0;
    int bitCount = 0;
    unsigned symbol = 0;
    unsigned const alphabetSize = maxSymbolValue + 1;
    int previousIs0 = 0;

    /* Table Size */
    bitStream += (tableLog-FSE_MIN_TABLELOG) << bitCount;
    bitCount  += 4;

    /* Init */
    remaining = tableSize+1;   /* +1 for extra accuracy */
    threshold = tableSize;
    nbBits = tableLog+1;

    while ((symbol < alphabetSize) && (remaining>1)) {  /* stops at 1 */
        if (previousIs0) {
            unsigned start = symbol;
            while ((symbol < alphabetSize) && !normalizedCounter[symbol]) symbol++;
            if (symbol == alphabetSize) break;   /* incorrect distribution */
            while (symbol >= start+24) {
                start+=24;
                bitStream += 0xFFFFU << bitCount;
                if ((!writeIsSafe) && (out > oend-2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE) bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out+=2;
                bitStream>>=16;
            }
            while (symbol >= start+3) {
                start+=3;
                bitStream += 3 << bitCount;
                bitCount += 2;
            }
            bitStream += (symbol-start) << bitCount;
            bitCount += 2;
            if (bitCount>16) {
                if ((!writeIsSafe) && (out > oend - 2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE)bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out += 2;
                bitStream >>= 16;
                bitCount -= 16;
        }   }
        {   int count = normalizedCounter[symbol++];
            int const max = (2*threshold-1) - remaining;
            remaining -= count < 0 ? -count : count;
            count++;   /* +1 for extra accuracy */
            if (count>=threshold)
                count += max;   /* [0..max[ [max..threshold[ (...) [threshold+max 2*threshold[ */
            bitStream += count << bitCount;
            bitCount  += nbBits;
            bitCount  -= (count<max);
            previousIs0  = (count==1);
            if (remaining<1) return ERROR(GENERIC);
            while (remaining<threshold) { nbBits--; threshold>>=1; }
        }
        if (bitCount>16) {
            if ((!writeIsSafe) && (out > oend - 2))
                return ERROR(dstSize_tooSmall);   /* Buffer overflow */
            out[0] = (BYTE)bitStream;
            out[1] = (BYTE)(bitStream>>8);
            out += 2;
            bitStream >>= 16;
            bitCount -= 16;
    }   }

    if (remaining != 1)
        return ERROR(GENERIC);  /* incorrect normalized distribution */
    assert(symbol <= alphabetSize);

    /* flush remaining bitStream */
    if ((!writeIsSafe) && (out > oend - 2))
        return ERROR(dstSize_tooSmall);   /* Buffer overflow */
    out[0] = (BYTE)bitStream;
    out[1] = (BYTE)(bitStream>>8);
    out+= (bitCount+7) /8;

    return (out-ostart);
}